

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_aux_mesh.cxx
# Opt level: O3

void __thiscall level_aux_mesh::build(level_aux_mesh *this,xr_level_hom *hom)

{
  b_face_vec *this_00;
  pointer *ppbVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  hom_poly *phVar6;
  iterator __position;
  ushort uVar7;
  hom_poly *phVar8;
  uint32_t *puVar9;
  uint32_t face_idx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> refs;
  b_face face;
  uint local_a0;
  uint local_9c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  anon_union_48_3_fb61167d_for_b_face_0 local_78;
  undefined4 uStack_48;
  undefined2 uStack_44;
  ushort uStack_42;
  undefined4 uStack_40;
  undefined2 uStack_3c;
  undefined2 uStack_3a;
  
  local_a0 = 0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&local_98,(ulong)(hom->m_num_polys * 3));
  this_00 = &(this->super_xr_mesh_builder).m_faces;
  std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
  reserve(this_00,(ulong)hom->m_num_polys);
  uStack_40 = 0xffffffff;
  uStack_3a = 0;
  local_78.field_0.v[0] = 0xffffffff;
  local_78.field_0.v[1] = 0xffffffff;
  local_78.field_0.v[2] = 0xffffffff;
  local_78.field_0.n[0] = 0xffffffff;
  local_78.field_0.n[1] = 0xffffffff;
  local_78.field_0.n[2] = 0xffffffff;
  local_78.field_0.tc[0] = 0xffffffff;
  local_78.field_0.tc[1] = 0xffffffff;
  local_78.field_0.tc[2] = 0xffffffff;
  local_78.field_0.link[0] = 0xffffffff;
  local_78.field_0.link[1] = 0xffffffff;
  local_78.field_0.link[2]._0_2_ = 0xffff;
  local_78.field_0.link[2]._2_2_ = 0xffff;
  uStack_48 = 0xffffffff;
  uStack_44 = 0xffff;
  uStack_42 = 0;
  uVar5 = hom->m_num_polys;
  if ((ulong)uVar5 != 0) {
    phVar6 = hom->m_polys;
    puVar9 = &phVar6->flags;
    do {
      fVar2 = *(float *)&((hom_poly *)(puVar9 + -9))->field_0;
      fVar3 = (float)puVar9[-6];
      if ((((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) ||
          ((float)puVar9[-8] != (float)puVar9[-5])) ||
         (NAN((float)puVar9[-8]) || NAN((float)puVar9[-5]))) {
LAB_00123544:
        fVar4 = (float)puVar9[-3];
        if (((fVar2 == fVar4) &&
            ((!NAN(fVar2) && !NAN(fVar4) && ((float)puVar9[-8] == (float)puVar9[-2])))) &&
           (!NAN((float)puVar9[-8]) && !NAN((float)puVar9[-2]))) {
          if (((float)puVar9[-7] == (float)puVar9[-1]) &&
             (!NAN((float)puVar9[-7]) && !NAN((float)puVar9[-1]))) goto LAB_0012369e;
        }
        if ((fVar3 == fVar4) &&
           (((!NAN(fVar3) && !NAN(fVar4) && ((float)puVar9[-5] == (float)puVar9[-2])) &&
            (!NAN((float)puVar9[-5]) && !NAN((float)puVar9[-2]))))) {
          if (((float)puVar9[-4] == (float)puVar9[-1]) &&
             (!NAN((float)puVar9[-4]) && !NAN((float)puVar9[-1]))) goto LAB_0012369e;
        }
        if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_98,
                     (iterator)
                     local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_a0);
        }
        else {
          *local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_a0;
          local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_9c = local_a0 | 1;
        if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_98,
                     (iterator)
                     local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_9c);
        }
        else {
          *local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_9c;
          local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_9c = local_a0 | 2;
        if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_98,
                     (iterator)
                     local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_9c);
        }
        else {
          *local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_9c;
          local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_a0 = local_a0 + 4;
        uVar7 = (ushort)(*puVar9 << 3);
        uStack_42 = uVar7 & 8;
        uStack_48 = 0;
        uStack_44 = 0;
        __position._M_current =
             (this->super_xr_mesh_builder).m_faces.
             super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->super_xr_mesh_builder).m_faces.
            super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<xray_re::xr_mesh_builder::b_face,std::allocator<xray_re::xr_mesh_builder::b_face>>
          ::_M_realloc_insert<xray_re::xr_mesh_builder::b_face_const&>
                    ((vector<xray_re::xr_mesh_builder::b_face,std::allocator<xray_re::xr_mesh_builder::b_face>>
                      *)this_00,__position,(b_face *)&local_78.field_0);
        }
        else {
          (__position._M_current)->field_1 =
               (anon_union_8_2_d279a524_for_b_face_2)(((ulong)uVar7 & 8) << 0x30);
          (__position._M_current)->tag = uStack_40;
          (__position._M_current)->temp = uStack_3c;
          (__position._M_current)->sector = uStack_3a;
          *(ulong *)((long)&(__position._M_current)->field_0 + 0x20) =
               CONCAT44(local_78.field_0.link[0],local_78.field_0.tc[2]);
          *(ulong *)((long)&(__position._M_current)->field_0 + 0x28) =
               CONCAT26(local_78.field_0.link[2]._2_2_,
                        CONCAT24(local_78.field_0.link[2]._0_2_,local_78.field_0.link[1]));
          *(ulong *)((long)&(__position._M_current)->field_0 + 0x10) =
               CONCAT44(local_78.field_0.n[2],local_78.field_0.n[1]);
          *(ulong *)((long)&(__position._M_current)->field_0 + 0x18) =
               CONCAT44(local_78.field_0.tc[1],local_78.field_0.tc[0]);
          *(ulong *)&(__position._M_current)->field_0 =
               CONCAT44(local_78.field_0.v[1],local_78.field_0.v[0]);
          *(ulong *)((long)&(__position._M_current)->field_0 + 8) =
               CONCAT44(local_78.field_0.n[0],local_78.field_0.v[2]);
          ppbVar1 = &(this->super_xr_mesh_builder).m_faces.
                     super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppbVar1 = *ppbVar1 + 1;
        }
      }
      else if (((float)puVar9[-7] != (float)puVar9[-4]) ||
              (NAN((float)puVar9[-7]) || NAN((float)puVar9[-4]))) goto LAB_00123544;
LAB_0012369e:
      phVar8 = (hom_poly *)(puVar9 + 1);
      puVar9 = puVar9 + 10;
    } while (phVar8 != phVar6 + uVar5);
  }
  if (local_a0 != 0) {
    compact_vertices<xray_re::hom_poly>(this,&local_98,hom->m_polys);
    create_uvs(this);
  }
  if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void level_aux_mesh::build(const xr_level_hom& hom)
{
	uint32_t face_idx = 0;
	std::vector<uint32_t> refs;
	refs.reserve(3*hom.num_polys());
	m_faces.reserve(hom.num_polys());
	b_face face;
	for (const hom_poly *it = hom.polys(), *end = it + hom.num_polys(); it != end; ++it) {
		if (it->v0 == it->v1 || it->v0 == it->v2 || it->v1 == it->v2)
			continue;
		refs.push_back(face_idx);
		refs.push_back(face_idx | 1);
		refs.push_back(face_idx | 2);
		face_idx += 4;
		face.surface.set(0, 0, 0, (it->flags & 0x1) ? RSF_TWO_SIDED : 0);
		m_faces.push_back(face);
	}
	if (face_idx) {
		compact_vertices(refs, hom.polys());
		create_uvs();
	}
}